

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

Result __thiscall
tonk::HostnameResolverState::GetNextServerAddress(HostnameResolverState *this,address *addr)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  char *pcVar4;
  address *in_RDX;
  long in_RSI;
  ErrorResult *in_RDI;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  address *in_stack_fffffffffffffea0;
  ErrorType in_stack_fffffffffffffeac;
  string *in_stack_fffffffffffffeb0;
  ErrorResult *desc;
  address_v4 *in_stack_fffffffffffffeb8;
  ErrorResult *in_stack_fffffffffffffec0;
  ErrorResult *this_00;
  undefined4 in_stack_fffffffffffffec8;
  undefined1 local_e1 [56];
  allocator local_a9;
  string local_a8 [32];
  address *local_88;
  undefined8 local_60;
  undefined4 local_54;
  string *local_50;
  char *local_48;
  undefined8 local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  char *local_10;
  
  local_88 = in_RDX;
  bVar1 = std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::empty
                    ((vector<asio::ip::address,_std::allocator<asio::ip::address>_> *)
                     in_stack_fffffffffffffeb0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Hostname did not resolve",&local_a9);
    local_48 = "Connection failed";
    local_50 = local_a8;
    local_54 = 0;
    local_60 = 0xb;
    pcVar4 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult
              (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0
               ,in_stack_fffffffffffffeac,(ErrorCodeT)in_stack_fffffffffffffea0);
    in_RDI->Source = pcVar4;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  else {
    uVar2 = *(int *)(in_RSI + 0x28) + 1;
    *(uint *)(in_RSI + 0x28) = uVar2;
    sVar3 = std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::size
                      ((vector<asio::ip::address,_std::allocator<asio::ip::address>_> *)
                       (in_RSI + 0x10));
    if ((uint)sVar3 <= uVar2) {
      *(undefined4 *)(in_RSI + 0x28) = 0;
    }
    if (*(int *)(in_RSI + 0x2c) == 0) {
      this_00 = (ErrorResult *)local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_e1 + 1),"No servers responded",(allocator *)this_00);
      local_10 = "Connection failed";
      local_18 = local_e1 + 1;
      local_1c = 0;
      local_28 = 0xb;
      desc = in_RDI;
      pcVar4 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (this_00,pcVar4,(string *)desc,in_stack_fffffffffffffeac,
                 (ErrorCodeT)in_stack_fffffffffffffea0);
      desc->Source = pcVar4;
      std::__cxx11::string::~string((string *)(local_e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_e1);
    }
    else {
      *(int *)(in_RSI + 0x2c) = *(int *)(in_RSI + 0x2c) + -1;
      std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::operator[]
                ((vector<asio::ip::address,_std::allocator<asio::ip::address>_> *)(in_RSI + 0x10),
                 (ulong)*(uint *)(in_RSI + 0x28));
      asio::ip::address::operator=
                (in_stack_fffffffffffffea0,
                 (address *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      bVar1 = asio::ip::address::is_v4(local_88);
      if (bVar1) {
        Result::Success();
      }
      else {
        bVar1 = asio::ip::address::is_loopback(in_stack_fffffffffffffea0);
        if (bVar1) {
          asio::ip::address_v4::loopback();
          asio::ip::address::operator=
                    ((address *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          Result::Success();
        }
        else {
          asio::ip::address::to_v4((address *)CONCAT44(uVar2,in_stack_fffffffffffffec8));
          asio::ip::address::operator=
                    ((address *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          Result::Success();
        }
      }
    }
  }
  return (Result)in_RDI;
}

Assistant:

Result HostnameResolverState::GetNextServerAddress(asio::ip::address& addr)
{
    // If there are no TCP addresses resolved:
    if (ResolvedIPAddresses.empty()) {
        return Result("Connection failed", "Hostname did not resolve", ErrorType::Tonk, Tonk_ConnectionTimeout);
    }

    // Try the next connection address
    if (++ConnectAddrIndex >= static_cast<unsigned>(ResolvedIPAddresses.size())) {
        ConnectAddrIndex = 0;
    }

    // Try once per server in the list
    if (ConnectRequestsRemaining <= 0) {
        return Result("Connection failed", "No servers responded", ErrorType::Tonk, Tonk_ConnectionTimeout);
    }
    --ConnectRequestsRemaining;

    addr = ResolvedIPAddresses[ConnectAddrIndex];
    if (addr.is_v4()) {
        return Result::Success();
    }

    try
    {
        // Workaround fix: IPv6 loopback is not handled properly by asio to_v4()
        if (addr.is_loopback())
        {
            addr = asio::ip::address_v4::loopback();
            return Result::Success();
        }

        addr = addr.to_v4();
    }
    catch (...)
    {
    }

    // Unable to convert, keep as IPv6
    return Result::Success();
}